

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O3

int parse_range_dec64(char **str_num,uint8_t dig,int64_t *num)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  ushort **ppuVar5;
  int64_t iVar6;
  long lVar7;
  long lVar8;
  uint8_t exp;
  char cVar9;
  int iVar10;
  char *pcVar11;
  uint uVar12;
  char cVar13;
  ulong uVar14;
  uint8_t uVar15;
  char cVar16;
  
  uVar12 = (uint)dig;
  cVar1 = **str_num;
  pcVar11 = *str_num + ((cVar1 - 0x2bU & 0xfd) == 0);
  ppuVar5 = __ctype_b_loc();
  uVar14 = (ulong)*pcVar11;
  uVar3 = (*ppuVar5)[uVar14];
  if ((uVar3 >> 0xb & 1) == 0) {
    return 1;
  }
  cVar9 = -1;
  lVar7 = 0;
  cVar16 = '\0';
  exp = '\0';
  do {
    cVar13 = (char)uVar14;
    if ((uVar3 >> 0xb & 1) == 0) {
      if ((cVar13 != '.') || (-1 < cVar9)) {
LAB_00112f05:
        if (cVar9 == '\0') {
          return 1;
        }
        if (cVar9 == -1) {
          cVar9 = '\0';
        }
        if (exp != '\0') {
          cVar9 = cVar9 - exp;
          cVar16 = cVar16 - exp;
          iVar6 = dec_pow(exp);
          lVar7 = lVar7 / iVar6;
        }
        iVar10 = (int)cVar9;
        iVar4 = uVar12 - iVar10;
        if (iVar4 != 0 && iVar10 <= (int)uVar12) {
          if (0x12 < cVar16 + iVar4 + -1) {
            return 1;
          }
          iVar6 = dec_pow((uint8_t)iVar4);
          lVar7 = lVar7 * iVar6;
        }
        if ((int)uVar12 < iVar10) {
          return 1;
        }
        lVar8 = -lVar7;
        if (cVar1 != '-') {
          lVar8 = lVar7;
        }
        *str_num = pcVar11;
        *num = lVar8;
        return 0;
      }
      if ('\x12' < cVar16) {
        return 1;
      }
LAB_00112ead:
      bVar2 = pcVar11[1];
      if (bVar2 == 0x2e) goto LAB_00112f05;
      cVar9 = cVar9 + '\x01';
    }
    else {
      if ('\x12' < cVar16) {
        return 1;
      }
      if (cVar13 == '.') goto LAB_00112ead;
      lVar7 = (long)cVar13 + lVar7 * 10 + -0x30;
      uVar15 = exp + '\x01';
      if (cVar13 != '0') {
        uVar15 = '\0';
      }
      if (-1 < cVar9) {
        exp = uVar15;
      }
      cVar9 = cVar9 + (-1 < cVar9);
      cVar16 = cVar16 + '\x01';
      bVar2 = pcVar11[1];
    }
    uVar14 = (ulong)bVar2;
    pcVar11 = pcVar11 + 1;
    uVar3 = (*ppuVar5)[(char)bVar2];
  } while( true );
}

Assistant:

int
parse_range_dec64(const char **str_num, uint8_t dig, int64_t *num)
{
    const char *ptr;
    int minus = 0;
    int64_t ret = 0;
    int8_t str_exp, str_dig = -1, trailing_zeros = 0;

    ptr = *str_num;

    if (ptr[0] == '-') {
        minus = 1;
        ++ptr;
    } else if (ptr[0] == '+') {
        ++ptr;
    }

    if (!isdigit(ptr[0])) {
        /* there must be at least one */
        return 1;
    }

    for (str_exp = 0; isdigit(ptr[0]) || ((ptr[0] == '.') && (str_dig < 0)); ++ptr) {
        if (str_exp > 18) {
            return 1;
        }

        if (ptr[0] == '.') {
            if (ptr[1] == '.') {
                /* it's the next interval */
                break;
            }
            ++str_dig;
        } else {
            ret = ret * 10 + (ptr[0] - '0');
            if (str_dig > -1) {
                ++str_dig;
                if (ptr[0] == '0') {
                    /* possibly trailing zero */
                    trailing_zeros++;
                } else {
                    trailing_zeros = 0;
                }
            }
            ++str_exp;
        }
    }
    if (str_dig == 0) {
        /* no digits after '.' */
        return 1;
    } else if (str_dig == -1) {
        /* there are 0 numbers after the floating point */
        str_dig = 0;
    }
    /* remove trailing zeros */
    if (trailing_zeros) {
        str_dig -= trailing_zeros;
        str_exp -= trailing_zeros;
        ret = ret / dec_pow(trailing_zeros);
    }

    /* it's parsed, now adjust the number based on fraction-digits, if needed */
    if (str_dig < dig) {
        if ((str_exp - 1) + (dig - str_dig) > 18) {
            return 1;
        }
        ret *= dec_pow(dig - str_dig);
    }
    if (str_dig > dig) {
        return 1;
    }

    if (minus) {
        ret *= -1;
    }
    *str_num = ptr;
    *num = ret;

    return 0;
}